

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if2ip.c
# Opt level: O1

if2ip_result_t
Curl_if2ip(int af,uint remote_scope,uint param_3,char *interf,char *buf,size_t buf_size)

{
  sockaddr *sa;
  long *plVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  if2ip_result_t iVar8;
  ifaddrs *head;
  char scope [12];
  char ipstr [64];
  char *local_a8;
  long *local_a0;
  undefined8 local_98;
  undefined4 local_90;
  size_t local_88;
  char *local_80;
  char local_78 [72];
  
  local_80 = buf;
  iVar5 = getifaddrs(&local_a0);
  if (iVar5 < 0) {
    iVar8 = IF2IP_NOT_FOUND;
  }
  else {
    iVar8 = IF2IP_NOT_FOUND;
    sVar4 = buf_size;
    sVar3 = local_88;
    for (plVar1 = local_a0; local_88 = sVar4, plVar1 != (long *)0x0; plVar1 = (long *)*plVar1) {
      if ((ushort *)plVar1[3] != (ushort *)0x0) {
        if ((uint)*(ushort *)plVar1[3] == af) {
          iVar5 = curl_strequal((char *)plVar1[1],interf);
          if (iVar5 != 0) {
            local_90 = 0;
            local_98 = 0;
            sa = (sockaddr *)plVar1[3];
            if (af == 10) {
              uVar6 = Curl_ipv6_scope(sa);
              if (uVar6 == remote_scope) {
                local_a8 = sa->sa_data + 6;
                if ((param_3 != 0) && (*(uint *)(sa[1].sa_data + 6) != param_3)) goto LAB_0013c733;
                bVar2 = true;
                iVar5 = 0;
                if (*(uint *)(sa[1].sa_data + 6) != 0) {
                  curl_msnprintf((char *)&local_98,0xc,"%%%u");
                  iVar5 = 0;
                }
              }
              else {
LAB_0013c733:
                iVar8 = iVar8 + (iVar8 == IF2IP_NOT_FOUND);
                bVar2 = false;
                iVar5 = 4;
              }
              buf_size = local_88;
              if (bVar2) goto LAB_0013c772;
            }
            else {
              local_a8 = sa->sa_data + 2;
LAB_0013c772:
              pcVar7 = inet_ntop(af,local_a8,local_78,0x40);
              curl_msnprintf(local_80,buf_size,"%s%s",pcVar7,&local_98);
              iVar8 = IF2IP_FOUND;
              iVar5 = 2;
            }
            sVar3 = local_88;
            if (iVar5 != 4) break;
          }
        }
        else if (iVar8 == IF2IP_NOT_FOUND) {
          iVar5 = curl_strequal((char *)plVar1[1],interf);
          iVar8 = (if2ip_result_t)(iVar5 != 0);
        }
      }
      sVar4 = local_88;
      sVar3 = local_88;
    }
    local_88 = sVar3;
    freeifaddrs(local_a0);
  }
  return iVar8;
}

Assistant:

if2ip_result_t Curl_if2ip(int af,
#ifdef USE_IPV6
                          unsigned int remote_scope,
                          unsigned int local_scope_id,
#endif
                          const char *interf,
                          char *buf, size_t buf_size)
{
  struct ifaddrs *iface, *head;
  if2ip_result_t res = IF2IP_NOT_FOUND;

#if defined(USE_IPV6) && \
    !defined(HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID)
  (void) local_scope_id;
#endif

  if(getifaddrs(&head) >= 0) {
    for(iface = head; iface != NULL; iface = iface->ifa_next) {
      if(iface->ifa_addr) {
        if(iface->ifa_addr->sa_family == af) {
          if(strcasecompare(iface->ifa_name, interf)) {
            void *addr;
            const char *ip;
            char scope[12] = "";
            char ipstr[64];
#ifdef USE_IPV6
            if(af == AF_INET6) {
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
              unsigned int scopeid = 0;
#endif
              unsigned int ifscope = Curl_ipv6_scope(iface->ifa_addr);

              if(ifscope != remote_scope) {
                /* We are interested only in interface addresses whose scope
                   matches the remote address we want to connect to: global
                   for global, link-local for link-local, etc... */
                if(res == IF2IP_NOT_FOUND)
                  res = IF2IP_AF_NOT_SUPPORTED;
                continue;
              }

              addr =
                &((struct sockaddr_in6 *)(void *)iface->ifa_addr)->sin6_addr;
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
              /* Include the scope of this interface as part of the address */
              scopeid = ((struct sockaddr_in6 *)(void *)iface->ifa_addr)
                            ->sin6_scope_id;

              /* If given, scope id should match. */
              if(local_scope_id && scopeid != local_scope_id) {
                if(res == IF2IP_NOT_FOUND)
                  res = IF2IP_AF_NOT_SUPPORTED;

                continue;
              }

              if(scopeid)
                msnprintf(scope, sizeof(scope), "%%%u", scopeid);
#endif
            }
            else
#endif
              addr =
                &((struct sockaddr_in *)(void *)iface->ifa_addr)->sin_addr;
            res = IF2IP_FOUND;
            ip = Curl_inet_ntop(af, addr, ipstr, sizeof(ipstr));
            msnprintf(buf, buf_size, "%s%s", ip, scope);
            break;
          }
        }
        else if((res == IF2IP_NOT_FOUND) &&
                strcasecompare(iface->ifa_name, interf)) {
          res = IF2IP_AF_NOT_SUPPORTED;
        }
      }
    }

    freeifaddrs(head);
  }

  return res;
}